

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test::
TestBody(DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test *this)

{
  TypeResolver *pTVar1;
  char *in_RCX;
  char *pcVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  string_view file_contents;
  string_view full_name;
  AssertHelper local_d0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Type type;
  
  file_contents._M_str =
       "\n    package: \"test\"\n    name: \"foo\"\n    syntax: \"proto3\"\n    message_type { name: \"MyMessage\" }\n  "
  ;
  file_contents._M_len = 99;
  DescriptorPoolTypeResolverSyntaxTest::BuildFile
            (&this->super_DescriptorPoolTypeResolverSyntaxTest,file_contents);
  Type::Type(&type);
  pTVar1 = (this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  full_name._M_str = in_RCX;
  full_name._M_len = (size_t)"test.MyMessage";
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
            ((string *)&gtest_ar,(_anonymous_namespace_ *)&DAT_0000000e,full_name);
  (*pTVar1->_vptr_TypeResolver[2])(&local_d0,pTVar1,&gtest_ar,&type);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.success_ = CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) == 1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  absl::lts_20250127::Status::~Status((Status *)&local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "resolver_->ResolveMessageType(GetTypeUrl(\"test.MyMessage\"), &type).ok()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x1cc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    gtest_ar_._0_4_ = type.field_0._impl_.syntax_;
    local_d0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<google::protobuf::Syntax,google::protobuf::Syntax>
              ((internal *)&gtest_ar,"type.syntax()","Syntax::SYNTAX_PROTO3",(Syntax *)&gtest_ar_,
               (Syntax *)&local_d0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1cd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    pcVar2 = anon_var_dwarf_651463 + 5;
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)&gtest_ar,"type.edition()","\"\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)type.field_0._impl_.edition_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
               (char (*) [1])(anon_var_dwarf_651463 + 5));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1ce,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    this_00 = &gtest_ar.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  Type::~Type(&type);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxProto3) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "proto3"
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_PROTO3);
  EXPECT_EQ(type.edition(), "");
}